

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool enchant(object *obj,wchar_t n,wchar_t eflag)

{
  byte *pbVar1;
  ulong uVar2;
  byte bVar3;
  object *poVar4;
  player_upkeep *ppVar5;
  int iVar6;
  int16_t iVar7;
  _Bool _Var8;
  _Bool _Var9;
  uint32_t uVar10;
  uint m;
  bool bVar11;
  
  bVar3 = obj->number;
  _Var8 = tval_is_ammo(obj);
  iVar6 = 100;
  if (_Var8) {
    iVar6 = 5;
  }
  m = iVar6 * (uint)bVar3;
  _Var8 = false;
  if (n < L'\x01') {
    n = L'\0';
  }
LAB_0014060a:
  bVar11 = n == L'\0';
  n = n + L'\xffffffff';
  if (bVar11) {
    poVar4 = obj->known;
    if (poVar4 != (object *)0x0) {
      poVar4->to_d = obj->to_d;
      iVar7 = obj->to_h;
      poVar4->to_a = obj->to_a;
      poVar4->to_h = iVar7;
      if (_Var8 != false) {
        ppVar5 = player->upkeep;
        uVar2._0_4_ = ppVar5->notice;
        uVar2._4_4_ = ppVar5->update;
        ppVar5->notice = (int)(uVar2 | 0x40100000001);
        ppVar5->update = (int)((uVar2 | 0x40100000001) >> 0x20);
        pbVar1 = (byte *)((long)&ppVar5->redraw + 2);
        *pbVar1 = *pbVar1 | 6;
      }
      return _Var8;
    }
    __assert_fail("obj->known",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                  ,0x159,"_Bool enchant(struct object *, int, int)");
  }
  if (100 < m) goto code_r0x00140616;
  goto LAB_00140623;
code_r0x00140616:
  uVar10 = Rand_div(m);
  if ((int)uVar10 < 100) {
LAB_00140623:
    if ((eflag & 1U) != 0) {
      _Var9 = enchant2(obj,&obj->to_h);
      _Var8 = (_Bool)(_Var8 | _Var9);
    }
    if ((eflag & 2U) != 0) {
      _Var9 = enchant2(obj,&obj->to_d);
      _Var8 = (_Bool)(_Var8 | _Var9);
    }
    if ((eflag & 4U) != 0) {
      _Var9 = enchant2(obj,&obj->to_a);
      _Var8 = (_Bool)(_Var8 | _Var9);
    }
  }
  goto LAB_0014060a;
}

Assistant:

static bool enchant(struct object *obj, int n, int eflag)
{
	int i, prob;
	bool res = false;

	/* Large piles resist enchantment */
	prob = obj->number * 100;

	/* Missiles are easy to enchant */
	if (tval_is_ammo(obj)) prob = prob / 20;

	/* Try "n" times */
	for (i = 0; i < n; i++)
	{
		/* Roll for pile resistance */
		if (prob > 100 && randint0(prob) >= 100) continue;

		/* Try the three kinds of enchantment we can do */
		if ((eflag & ENCH_TOHIT) && enchant2(obj, &obj->to_h)) res = true;
		if ((eflag & ENCH_TODAM) && enchant2(obj, &obj->to_d)) res = true;
		if ((eflag & ENCH_TOAC)  && enchant2(obj, &obj->to_a)) res = true;
	}

	/* Update knowledge */
	assert(obj->known);
	obj->known->to_h = obj->to_h;
	obj->known->to_d = obj->to_d;
	obj->known->to_a = obj->to_a;

	/* Failure */
	if (!res) return (false);

	/* Recalculate bonuses, gear */
	player->upkeep->update |= (PU_BONUS | PU_INVEN);

	/* Combine the pack (later) */
	player->upkeep->notice |= (PN_COMBINE);

	/* Redraw stuff */
	player->upkeep->redraw |= (PR_INVEN | PR_EQUIP );

	/* Success */
	return (true);
}